

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O1

void * __thiscall msgpack::v1::zone::operator_new(zone *this,size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = malloc((size_t)this);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = __cxa_init_primary_exception;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void* operator new(std::size_t size)
    {
        void* p = ::malloc(size);
        if (!p) throw std::bad_alloc();
        return p;
    }